

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t psa_cipher_set_iv(psa_cipher_operation_t *operation,uint8_t *iv,size_t iv_length)

{
  int ret_00;
  int local_2c;
  int ret;
  psa_status_t status;
  size_t iv_length_local;
  uint8_t *iv_local;
  psa_cipher_operation_t *operation_local;
  
  if ((((byte)operation->field_0x4 >> 2 & 1) == 0) && (((byte)operation->field_0x4 >> 1 & 1) != 0))
  {
    if (iv_length == operation->iv_size) {
      ret_00 = mbedtls_cipher_set_iv(&(operation->ctx).cipher,iv,iv_length);
      local_2c = mbedtls_to_psa_error(ret_00);
    }
    else {
      local_2c = -0x87;
    }
    if (local_2c == 0) {
      operation->field_0x4 = operation->field_0x4 & 0xfb | 4;
    }
    else {
      psa_cipher_abort(operation);
    }
    operation_local._4_4_ = local_2c;
  }
  else {
    operation_local._4_4_ = -0x89;
  }
  return operation_local._4_4_;
}

Assistant:

psa_status_t psa_cipher_set_iv( psa_cipher_operation_t *operation,
                                const uint8_t *iv,
                                size_t iv_length )
{
    psa_status_t status;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    if( operation->iv_set || ! operation->iv_required )
    {
        return( PSA_ERROR_BAD_STATE );
    }
    if( iv_length != operation->iv_size )
    {
        status = PSA_ERROR_INVALID_ARGUMENT;
        goto exit;
    }
    ret = mbedtls_cipher_set_iv( &operation->ctx.cipher, iv, iv_length );
    status = mbedtls_to_psa_error( ret );
exit:
    if( status == PSA_SUCCESS )
        operation->iv_set = 1;
    else
        psa_cipher_abort( operation );
    return( status );
}